

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O0

void tio_set_html_expansion(uint html_char_val,char *expansion,size_t expansion_len)

{
  char *pcVar1;
  size_t in_RDX;
  void *in_RSI;
  uint in_EDI;
  amp_tbl_t *p;
  amp_tbl_t *local_20;
  
  local_20 = amp_tbl;
  while( true ) {
    if ((amp_tbl_t *)0x44f56f < local_20) {
      return;
    }
    if (local_20->html_cval == in_EDI) break;
    local_20 = local_20 + 1;
  }
  pcVar1 = (char *)malloc(in_RDX + 1);
  local_20->expan = pcVar1;
  memcpy(local_20->expan,in_RSI,in_RDX);
  local_20->expan[in_RDX] = '\0';
  return;
}

Assistant:

void tio_set_html_expansion(unsigned int html_char_val,
                            const char *expansion, size_t expansion_len)
{
    struct amp_tbl_t *p;

    /* find the character value */
    for (p = amp_tbl ;
         p < amp_tbl + sizeof(amp_tbl)/sizeof(amp_tbl[0]) ; ++p)
    {
        /* if this is the one, store it */
        if (p->html_cval == html_char_val)
        {
            /* allocate space for it */
            p->expan = (char *)osmalloc(expansion_len + 1);

            /* save it */
            memcpy(p->expan, expansion, expansion_len);
            p->expan[expansion_len] = '\0';

            /* no need to look any further */
            return;
        }
    }
}